

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate2.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::PointerGate2<std::complex<double>_>::equals
          (PointerGate2<std::complex<double>_> *this,QObject<std::complex<double>_> *other)

{
  QObject<std::complex<double>_> *pQVar1;
  QObject<std::complex<double>_> *other_00;
  PointerGate2<std::complex<double>_> *local_40;
  G *p;
  QObject<std::complex<double>_> *other_local;
  PointerGate2<std::complex<double>_> *this_local;
  
  if (other == (QObject<std::complex<double>_> *)0x0) {
    local_40 = (PointerGate2<std::complex<double>_> *)0x0;
  }
  else {
    local_40 = (PointerGate2<std::complex<double>_> *)
               __dynamic_cast(other,&QObject<std::complex<double>>::typeinfo,
                              &PointerGate2<std::complex<double>>::typeinfo,0);
  }
  if (local_40 == (PointerGate2<std::complex<double>_> *)0x0) {
    pQVar1 = &ptr(this)->super_QObject<std::complex<double>_>;
    this_local._7_1_ = QObject<std::complex<double>_>::operator==(other,pQVar1);
  }
  else {
    pQVar1 = &ptr(local_40)->super_QObject<std::complex<double>_>;
    other_00 = &ptr(this)->super_QObject<std::complex<double>_>;
    this_local._7_1_ = QObject<std::complex<double>_>::operator==(pQVar1,other_00);
  }
  return this_local._7_1_;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate2< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }